

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::containsMatchingBasicType
          (UniformCollection *this,dataTypePredicate predicate)

{
  pointer pUVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  VarType *type;
  long lVar6;
  long lVar7;
  
  pUVar1 = (this->m_uniforms).
           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)(this->m_uniforms).
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 3) *
          -0x49249249;
  bVar5 = 0 < iVar3;
  if ((0 < iVar3) && (bVar2 = typeContainsMatchingBasicType(&pUVar1->type,predicate), !bVar2)) {
    lVar7 = 0x58;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + 1;
      pUVar1 = (this->m_uniforms).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)((int)((ulong)((long)(this->m_uniforms).
                                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1)
                          >> 3) * -0x49249249);
      bVar5 = lVar6 < lVar4;
      if (lVar4 <= lVar6) {
        return bVar5;
      }
      type = (VarType *)((long)&(pUVar1->name)._M_dataplus + lVar7);
      lVar7 = lVar7 + 0x38;
      bVar2 = typeContainsMatchingBasicType(type,predicate);
    } while (!bVar2);
  }
  return bVar5;
}

Assistant:

bool containsMatchingBasicType (const dataTypePredicate predicate) const
	{
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			if (typeContainsMatchingBasicType(m_uniforms[i].type, predicate))
				return true;
		return false;
	}